

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::TiledInputFile::rawTileData
          (TiledInputFile *this,int *dx,int *dy,int *lx,int *ly,char **pixelData,int *pixelDataSize)

{
  uint lx_00;
  uint ly_00;
  int dy_00;
  Data *pDVar1;
  IStream *pIVar2;
  InputStreamMutex *pIVar3;
  TiledInputFile *pTVar4;
  bool bVar5;
  int iVar6;
  Int64 *pIVar7;
  IoExc *this_00;
  ArgExc *this_01;
  code *pcVar8;
  undefined *puVar9;
  char *pcVar10;
  char b [4];
  stringstream _iex_replace_s;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  uint local_1e8;
  uint local_1e4;
  TiledInputFile *local_1e0;
  pthread_mutex_t *local_1d8;
  TileBuffer *local_1d0;
  int *local_1c8;
  char **local_1c0;
  
  local_1d8 = (pthread_mutex_t *)this->_data->_streamData;
  iVar6 = pthread_mutex_lock(local_1d8);
  local_1e0 = this;
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  local_1ec = *dx;
  local_1f0 = *dy;
  local_1e8 = *lx;
  local_1e4 = *ly;
  local_1c8 = dy;
  local_1c0 = pixelData;
  bVar5 = isValidTile(this,local_1ec,local_1f0,local_1e8,local_1e4);
  if (!bVar5) {
    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(this_01,"Tried to read a tile outside the image file\'s data window.");
    __cxa_throw(this_01,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  pDVar1 = this->_data;
  local_1d0 = *(pDVar1->tileBuffers).
               super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  if ((pDVar1->version & 0x1000) != 0) {
    pIVar2 = pDVar1->_streamData->is;
    pIVar7 = TileOffsets::operator()(&pDVar1->tileOffsets,local_1ec,local_1f0,local_1e8,local_1e4);
    (*pIVar2->_vptr_IStream[6])(pIVar2,*pIVar7);
  }
  pDVar1 = local_1e0->_data;
  pIVar3 = pDVar1->_streamData;
  if ((pDVar1->version & 0x1000) == 0) {
LAB_00594bad:
    (*pIVar3->is->_vptr_IStream[3])(pIVar3->is,&local_1f4,4);
    *dx = local_1f4;
    (*pIVar3->is->_vptr_IStream[3])(pIVar3->is,&local_1f4,4);
    *local_1c8 = local_1f4;
    (*pIVar3->is->_vptr_IStream[3])(pIVar3->is,&local_1f4,4);
    *lx = local_1f4;
    (*pIVar3->is->_vptr_IStream[3])(pIVar3->is,&local_1f4,4);
    *ly = local_1f4;
    (*pIVar3->is->_vptr_IStream[3])(pIVar3->is,&local_1f4,4);
    *pixelDataSize = local_1f4;
    if (local_1f4 <= (int)pDVar1->tileBufferSize) {
      (*pIVar3->is->_vptr_IStream[3])(pIVar3->is,local_1d0->buffer);
      pTVar4 = local_1e0;
      pIVar3->currentPosition = (long)*pixelDataSize + pIVar3->currentPosition + 0x14;
      lx_00 = *lx;
      ly_00 = *ly;
      if ((((int)(ly_00 | lx_00) < 0) ||
          (((pDVar1 = local_1e0->_data, lx_00 != ly_00 && ((pDVar1->tileDesc).mode == MIPMAP_LEVELS)
            ) || (pDVar1->numXLevels <= (int)lx_00)))) || (pDVar1->numYLevels <= (int)ly_00)) {
LAB_00594d6c:
        this_00 = (IoExc *)__cxa_allocate_exception(0x48);
        pcVar10 = "File contains an invalid tile";
      }
      else {
        iVar6 = *dx;
        dy_00 = *local_1c8;
        bVar5 = isValidTile(local_1e0,iVar6,dy_00,lx_00,ly_00);
        if (!bVar5) goto LAB_00594d6c;
        if ((pTVar4->_data->version & 0x1000) == 0) {
          if (bVar5) {
LAB_00594d3f:
            *local_1c0 = local_1d0->buffer;
            pthread_mutex_unlock(local_1d8);
            return;
          }
          this_00 = (IoExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::IoExc::IoExc(this_00,"rawTileData read an invalid tile");
          pcVar8 = Iex_2_5::IoExc::~IoExc;
          puVar9 = &Iex_2_5::IoExc::typeinfo;
          goto LAB_00594e16;
        }
        if (((local_1e4 == ly_00) && (local_1e8 == lx_00)) &&
           ((local_1ec == iVar6 && (local_1f0 == dy_00)))) goto LAB_00594d3f;
        this_00 = (IoExc *)__cxa_allocate_exception(0x48);
        pcVar10 = "rawTileData read the wrong tile";
      }
      Iex_2_5::ArgExc::ArgExc((ArgExc *)this_00,pcVar10);
      pcVar8 = Iex_2_5::ArgExc::~ArgExc;
      puVar9 = &Iex_2_5::ArgExc::typeinfo;
      goto LAB_00594e16;
    }
    this_00 = (IoExc *)__cxa_allocate_exception(0x48);
    pcVar10 = "Unexpected tile block length.";
  }
  else {
    (*pIVar3->is->_vptr_IStream[3])(pIVar3->is,&local_1f4,4);
    if (local_1f4 == pDVar1->partNumber) goto LAB_00594bad;
    this_00 = (IoExc *)__cxa_allocate_exception(0x48);
    pcVar10 = "Unexpected part number in readNextTileData";
  }
  Iex_2_5::InputExc::InputExc((InputExc *)this_00,pcVar10);
  pcVar8 = Iex_2_5::InputExc::~InputExc;
  puVar9 = &Iex_2_5::InputExc::typeinfo;
LAB_00594e16:
  __cxa_throw(this_00,puVar9,pcVar8);
}

Assistant:

void
TiledInputFile::rawTileData (int &dx, int &dy,
			     int &lx, int &ly,
                             const char *&pixelData,
			     int &pixelDataSize)
{
    try
    {
        Lock lock (*_data->_streamData);

        if (!isValidTile (dx, dy, lx, ly))
            throw IEX_NAMESPACE::ArgExc ("Tried to read a tile outside "
			       "the image file's data window.");

        TileBuffer *tileBuffer = _data->getTileBuffer (0);

        //
        // if file is a multipart file, we have to seek to the required tile
        // since we don't know where the file pointer is
        //
        int old_dx=dx;
        int old_dy=dy;
        int old_lx=lx;
        int old_ly=ly;
        if(isMultiPart(version()))
        {
            _data->_streamData->is->seekg(_data->tileOffsets(dx,dy,lx,ly));
        }
        readNextTileData (_data->_streamData, _data, dx, dy, lx, ly,
			  tileBuffer->buffer,
                          pixelDataSize);

        if ( !isValidLevel(lx,ly) || !isValidTile (dx, dy, lx, ly) )
            throw IEX_NAMESPACE::ArgExc ("File contains an invalid tile");


        if(isMultiPart(version()))
        {
            if (old_dx!=dx || old_dy !=dy || old_lx!=lx || old_ly!=ly)
            {
                throw IEX_NAMESPACE::ArgExc ("rawTileData read the wrong tile");
            }
        }
        else
        {
             if(!isValidTile (dx, dy, lx, ly) )
             {
                 throw IEX_NAMESPACE::IoExc ("rawTileData read an invalid tile");
             }
        }
        pixelData = tileBuffer->buffer;
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Error reading pixel data from image "
                     "file \"" << fileName() << "\". " << e.what());
        throw;
    }
}